

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_alpn_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  SSL *pSVar1;
  bool bVar2;
  int iVar3;
  uchar *data;
  size_t len;
  undefined1 local_b8 [8];
  CBB proto;
  CBB proto_list;
  CBB contents;
  SSL *ssl;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  pSVar1 = hs->ssl;
  bVar2 = Array<unsigned_char>::empty(&pSVar1->s3->alpn_selected);
  if (bVar2) {
    hs_local._7_1_ = true;
  }
  else {
    iVar3 = CBB_add_u16(out,0x10);
    if ((((iVar3 != 0) &&
         (iVar3 = CBB_add_u16_length_prefixed(out,(CBB *)((long)&proto_list.u + 0x18)), iVar3 != 0))
        && (iVar3 = CBB_add_u16_length_prefixed
                              ((CBB *)((long)&proto_list.u + 0x18),(CBB *)((long)&proto.u + 0x18)),
           iVar3 != 0)) &&
       (iVar3 = CBB_add_u8_length_prefixed((CBB *)((long)&proto.u + 0x18),(CBB *)local_b8),
       iVar3 != 0)) {
      data = Array<unsigned_char>::data(&pSVar1->s3->alpn_selected);
      len = Array<unsigned_char>::size(&pSVar1->s3->alpn_selected);
      iVar3 = CBB_add_bytes((CBB *)local_b8,data,len);
      if ((iVar3 != 0) && (iVar3 = CBB_flush(out), iVar3 != 0)) {
        return true;
      }
    }
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_alpn_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  if (ssl->s3->alpn_selected.empty()) {
    return true;
  }

  CBB contents, proto_list, proto;
  if (!CBB_add_u16(out, TLSEXT_TYPE_application_layer_protocol_negotiation) ||
      !CBB_add_u16_length_prefixed(out, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &proto_list) ||
      !CBB_add_u8_length_prefixed(&proto_list, &proto) ||
      !CBB_add_bytes(&proto, ssl->s3->alpn_selected.data(),
                     ssl->s3->alpn_selected.size()) ||
      !CBB_flush(out)) {
    return false;
  }

  return true;
}